

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.h
# Opt level: O1

void __thiscall
crampl::detail::Function<std::tuple<int,int>(),false>::
Function<crampl::detail::Function<std::tuple<int,int>(),false>>
          (Function<std::tuple<int,int>(),false> *this,
          Function<std::tuple<int,_int>_(),_false> *lambda)

{
  *(code **)(this + 8) = Function<std::tuple<int,_int>_(),_false>::bad_invoke;
  *(code **)(this + 0x10) = Function<std::tuple<int,_int>_(),_false>::noop_manager;
  *(_func_void_selfType_ptr_selfType_ptr_conflict **)(this + 0x10) = lambda->manager;
  lambda->manager = Function<std::tuple<int,_int>_(),_false>::noop_manager;
  *(_func_tuple<int,_int>_VoidPtrWithConstness **)(this + 8) = lambda->invoke;
  lambda->invoke = Function<std::tuple<int,_int>_(),_false>::bad_invoke;
  (**(code **)(this + 0x10))(lambda,this);
  return;
}

Assistant:

Function(T&& lambda) noexcept {
		init_from(std::forward<T>(lambda));
	}